

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.lex.cc
# Opt level: O0

void ppyy_init_buffer(YY_BUFFER_STATE b,FILE *file)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  uint local_34;
  YY_BUFFER_STATE local_30;
  int oerrno;
  FILE *file_local;
  YY_BUFFER_STATE b_local;
  
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  ppyy_flush_buffer(b);
  b->yy_input_file = file;
  b->yy_fill_buffer = 1;
  if (yy_buffer_stack == (YY_BUFFER_STATE *)0x0) {
    local_30 = (YY_BUFFER_STATE)0x0;
  }
  else {
    local_30 = yy_buffer_stack[yy_buffer_stack_top];
  }
  if (b != local_30) {
    b->yy_bs_lineno = 1;
    b->yy_bs_column = 0;
  }
  if (file == (FILE *)0x0) {
    local_34 = 0;
  }
  else {
    iVar2 = fileno((FILE *)file);
    iVar2 = isatty(iVar2);
    local_34 = (uint)(0 < iVar2);
  }
  b->yy_is_interactive = local_34;
  piVar3 = __errno_location();
  *piVar3 = iVar1;
  return;
}

Assistant:

static void yy_init_buffer  (YY_BUFFER_STATE  b, FILE * file )

{
	int oerrno = errno;
    
	yy_flush_buffer( b );

	b->yy_input_file = file;
	b->yy_fill_buffer = 1;

    /* If b is the current buffer, then yy_init_buffer was _probably_
     * called from yyrestart() or through yy_get_next_buffer.
     * In that case, we don't want to reset the lineno or column.
     */
    if (b != YY_CURRENT_BUFFER){
        b->yy_bs_lineno = 1;
        b->yy_bs_column = 0;
    }

        b->yy_is_interactive = file ? (isatty( fileno(file) ) > 0) : 0;
    
	errno = oerrno;
}